

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

uint nullcGetCurrentExecutor(void **exec)

{
  uint uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  
  uVar1 = NULLC::currExec;
  if (exec != (void **)0x0) {
    pvVar2 = NULLC::executorX86;
    if (NULLC::currExec != 1) {
      puVar3 = &NULLC::executorRegVm;
      if (NULLC::currExec == 2) {
        puVar3 = &NULLC::executorLLVM;
      }
      pvVar2 = (void *)*puVar3;
    }
    *exec = pvVar2;
  }
  return uVar1;
}

Assistant:

unsigned int nullcGetCurrentExecutor(void **exec)
{
	using namespace NULLC;

#if !defined(NULLC_NO_EXECUTOR)
	if(exec)
		*exec = currExec == NULLC_X86 ? (void*)executorX86 : (currExec == NULLC_LLVM ? (void*)executorLLVM : (void*)executorRegVm);
#else
	*exec = NULL;
#endif

	return currExec;
}